

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_grammar.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::AssemblyGrammar::lookupSpecConstantOpcode(AssemblyGrammar *this,Op opcode)

{
  spv_ext_inst_table_t *psVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x3c0) {
      psVar1 = (spv_ext_inst_table_t *)
               (&DAT_00a71ae0 + (ulong)(opcode != OpCooperativeMatrixLengthKHR) * 0x10);
LAB_0050bb06:
      return (uint)(psVar1 != &kTable_1_0) * 9 + SPV_ERROR_INVALID_LOOKUP;
    }
    if (*(Op *)((long)&(anonymous_namespace)::kOpSpecConstantOpcodes + lVar2) == opcode) {
      psVar1 = (spv_ext_inst_table_t *)
               ((long)&(anonymous_namespace)::kOpSpecConstantOpcodes + lVar2);
      goto LAB_0050bb06;
    }
    if (*(Op *)((long)&DAT_00a71730 + lVar2) == opcode) {
      psVar1 = (spv_ext_inst_table_t *)((long)&DAT_00a71730 + lVar2);
      goto LAB_0050bb06;
    }
    if (*(Op *)((long)&DAT_00a71740 + lVar2) == opcode) {
      psVar1 = (spv_ext_inst_table_t *)((long)&DAT_00a71740 + lVar2);
      goto LAB_0050bb06;
    }
    if (*(Op *)((long)&DAT_00a71750 + lVar2) == opcode) {
      psVar1 = (spv_ext_inst_table_t *)((long)&DAT_00a71750 + lVar2);
      goto LAB_0050bb06;
    }
    lVar2 = lVar2 + 0x40;
  } while( true );
}

Assistant:

spv_result_t AssemblyGrammar::lookupSpecConstantOpcode(spv::Op opcode) const {
  const auto* last = kOpSpecConstantOpcodes + kNumOpSpecConstantOpcodes;
  const auto* found =
      std::find_if(kOpSpecConstantOpcodes, last,
                   [opcode](const SpecConstantOpcodeEntry& entry) {
                     return opcode == entry.opcode;
                   });
  if (found == last) return SPV_ERROR_INVALID_LOOKUP;
  return SPV_SUCCESS;
}